

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putRGBcontig8bitCMYKMaptile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  TIFFRGBValue *pTVar2;
  uint32_t uVar3;
  uint uVar4;
  
  if (h != 0) {
    pTVar2 = img->Map;
    uVar1 = img->samplesperpixel;
    do {
      uVar3 = w;
      if (w != 0) {
        do {
          uVar4 = pp[3] ^ 0xff;
          *cp = CONCAT12(pTVar2[((pp[2] ^ 0xff) * uVar4) / 0xff],
                         CONCAT11(pTVar2[((pp[1] ^ 0xff) * uVar4) / 0xff],
                                  pTVar2[((*pp ^ 0xff) * uVar4) / 0xff])) | 0xff000000;
          cp = cp + 1;
          pp = pp + uVar1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      pp = pp + (long)fromskew * (ulong)uVar1;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bitCMYKMaptile)
{
    int samplesperpixel = img->samplesperpixel;
    TIFFRGBValue *Map = img->Map;
    uint16_t r, g, b, k;

    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            k = 255 - pp[3];
            r = (k * (255 - pp[0])) / 255;
            g = (k * (255 - pp[1])) / 255;
            b = (k * (255 - pp[2])) / 255;
            *cp++ = PACK(Map[r], Map[g], Map[b]);
            pp += samplesperpixel;
        }
        pp += fromskew;
        cp += toskew;
    }
}